

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCpuId.cpp
# Opt level: O2

void testCpuId(string *param_1)

{
  ostream *poVar1;
  CpuId cpuId;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_SSE2: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_SSE4_1: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"IMF_HAVE_AVX: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  Imf_3_4::CpuId::CpuId(&cpuId);
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse2: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse3: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.ssse3: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse4_1: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.sse4_2: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.avx: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"cpuId.f16c: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testCpuId (const string&)
{
#if defined(IMF_HAVE_SSE2)
    std::cout << "IMF_HAVE_SSE2: " << true << "\n";
#else
    std::cout << "IMF_HAVE_SSE2: " << false << "\n";
#endif
#if defined(IMF_HAVE_SSE4_1)
    std::cout << "IMF_HAVE_SSE4_1: " << true << "\n";
#else
    std::cout << "IMF_HAVE_SSE4_1: " << false << "\n";
#endif
#if defined(IMF_HAVE_AVX)
    std::cout << "IMF_HAVE_AVX: " << true << "\n";
#else
    std::cout << "IMF_HAVE_AVX: " << false << "\n";
#endif

    OPENEXR_IMF_NAMESPACE::CpuId cpuId;
    std::cout << "cpuId.sse2: " << cpuId.sse2 << "\n";
    std::cout << "cpuId.sse3: " << cpuId.sse3 << "\n";
    std::cout << "cpuId.ssse3: " << cpuId.ssse3 << "\n";
    std::cout << "cpuId.sse4_1: " << cpuId.sse4_1 << "\n";
    std::cout << "cpuId.sse4_2: " << cpuId.sse4_2 << "\n";
    std::cout << "cpuId.avx: " << cpuId.avx << "\n";
    std::cout << "cpuId.f16c: " << cpuId.f16c << std::endl;
}